

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearfit.cpp
# Opt level: O1

int __thiscall Polynomial::copy(Polynomial *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  double *__dest;
  double *__dest_00;
  void *pvVar1;
  uint in_ECX;
  ulong uVar2;
  
  this->ocount = in_ECX;
  uVar2 = 0xffffffffffffffff;
  if (-1 < (int)in_ECX) {
    uVar2 = (long)(int)in_ECX * 8;
  }
  __dest = (double *)operator_new__(uVar2);
  this->osx = __dest;
  __dest_00 = (double *)operator_new__(uVar2);
  this->osy = __dest_00;
  if (0 < (int)in_ECX) {
    memcpy(__dest,dst,(ulong)in_ECX << 3);
    pvVar1 = memcpy(__dest_00,src,(ulong)in_ECX << 3);
    return (int)pvVar1;
  }
  return (int)__dest_00;
}

Assistant:

void Polynomial::copy(double *x, double *y, int count)
{
    ocount = count;
    osx = new double[count] , osy = new double[count];
    for(int i(0) ; i < count ; i++)
    {
        osx[i] = x[i] ;
        osy[i] = y[i] ;
    }
}